

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall myGame::Game::redraw(Game *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  int j;
  int iVar4;
  long lVar5;
  int i;
  long lVar6;
  pointer ppOVar7;
  int i_1;
  Point t;
  Point local_60;
  Point window_coord;
  Point s;
  Point local_48 [2];
  Point zero;
  
  clear();
  move(1,1);
  Snake::head_coord((Snake *)&s);
  iVar4 = Snake::get_points(&this->snake);
  printw("Your points: %d (%d, %d)",iVar4,s.x,s.y);
  for (lVar6 = 0; lVar6 < this->H; lVar6 = lVar6 + 1) {
    for (lVar5 = 0; lVar5 < this->W; lVar5 = lVar5 + 1) {
      this->map[lVar6][lVar5] = '.';
    }
  }
  local_48[0].x = this->W / 2;
  local_48[0].y = this->H / 2;
  operator-(&s,local_48);
  zero.x = 0;
  zero.y = 0;
  uVar1 = this->H;
  uVar2 = this->W;
  local_60.y = uVar1;
  local_60.x = uVar2;
  for (ppOVar7 = Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppOVar7 !=
      Object::obj.super__Vector_base<Object_*,_std::allocator<Object_*>_>._M_impl.
      super__Vector_impl_data._M_finish; ppOVar7 = ppOVar7 + 1) {
    Object::get_position((Object *)(local_48 + 1));
    operator-(local_48 + 1,&window_coord);
    bVar3 = operator<(&zero,&t);
    if (bVar3) {
      bVar3 = operator<(&t,&local_60);
      if (bVar3) {
        this->map[t.y][t.x] = (*ppOVar7)->ch;
      }
    }
  }
  for (lVar6 = 0; lVar6 < this->H; lVar6 = lVar6 + 1) {
    move((int)lVar6 + 3,3);
    printw("%s",this->map[lVar6]);
  }
  refresh();
  return;
}

Assistant:

void Game::redraw(){
	clear();
	move(1, 1);
	Point s = snake.head_coord();
	printw("Your points: %d (%d, %d)", snake.get_points(), s.x, s.y);
	for (int i = 0; i < H; i++){
		for (int j = 0; j < W; j++){
			map[i][j] = CHR_NOTHING;
		}
	}
	Point mid = Point(W/2, H/2);
	Point window_coord = s - mid;
	Point zero = Point(0, 0);
	Point rb = Point(W, H);
	for (vector<PObject>::iterator i = Object::obj.begin(); i != Object::obj.end(); i++){
		Point t = (*i)->get_position() - window_coord;
		if (zero < t && t < rb){
			map[t.y][t.x] = (*i)->get_char();
		}

	}
	for (int i = 0; i < H; i++){
		move(i + 3, 3);
		printw("%s", map[i]);
	}
	refresh();
}